

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

TargetPropertyEntry *
CreateTargetPropertyEntry
          (string *propertyValue,cmListFileBacktrace *backtrace,bool evaluateForBuildsystem)

{
  size_type sVar1;
  pointer this;
  cmListFileBacktrace local_a0;
  string local_90;
  undefined1 local_69;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_68;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmListFileBacktrace local_48;
  undefined1 local_38 [8];
  cmGeneratorExpression ge;
  bool evaluateForBuildsystem_local;
  cmListFileBacktrace *backtrace_local;
  string *propertyValue_local;
  
  ge.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ._7_1_ = evaluateForBuildsystem;
  sVar1 = cmGeneratorExpression::Find(propertyValue);
  if (sVar1 == 0xffffffffffffffff) {
    propertyValue_local = (string *)operator_new(0x50);
    std::__cxx11::string::string((string *)&local_90,(string *)propertyValue);
    cmListFileBacktrace::cmListFileBacktrace(&local_a0,backtrace);
    TargetPropertyEntryString::TargetPropertyEntryString
              ((TargetPropertyEntryString *)propertyValue_local,&local_90,&local_a0,
               &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem);
    cmListFileBacktrace::~cmListFileBacktrace(&local_a0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    cmListFileBacktrace::cmListFileBacktrace(&local_48,backtrace);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_38,&local_48);
    cmListFileBacktrace::~cmListFileBacktrace(&local_48);
    cmGeneratorExpression::Parse
              ((cmGeneratorExpression *)&stack0xffffffffffffffa0,(string *)local_38);
    this = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)&stack0xffffffffffffffa0);
    cmCompiledGeneratorExpression::SetEvaluateForBuildsystem
              (this,(bool)(ge.Backtrace.TopEntry.
                           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi._7_1_ & 1));
    propertyValue_local = (string *)operator_new(0x28);
    local_69 = 1;
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    unique_ptr(&local_68,
               (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                *)&stack0xffffffffffffffa0);
    TargetPropertyEntryGenex::TargetPropertyEntryGenex
              ((TargetPropertyEntryGenex *)propertyValue_local,&local_68,
               &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem);
    local_69 = 0;
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&local_68);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&stack0xffffffffffffffa0);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_38);
  }
  return (TargetPropertyEntry *)propertyValue_local;
}

Assistant:

cmGeneratorTarget::TargetPropertyEntry* CreateTargetPropertyEntry(
  const std::string& propertyValue,
  cmListFileBacktrace backtrace = cmListFileBacktrace(),
  bool evaluateForBuildsystem = false)
{
  if (cmGeneratorExpression::Find(propertyValue) != std::string::npos) {
    cmGeneratorExpression ge(std::move(backtrace));
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(propertyValue);
    cge->SetEvaluateForBuildsystem(evaluateForBuildsystem);
    return new TargetPropertyEntryGenex(std::move(cge));
  }

  return new TargetPropertyEntryString(propertyValue, backtrace);
}